

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O1

int TIFFReadBufferSetup(TIFF *tif,void *bp,tmsize_t size)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong siz;
  bool bVar3;
  
  uVar1 = tif->tif_flags;
  if ((uVar1 >> 0x11 & 1) != 0) {
    __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                  ,0x545,"int TIFFReadBufferSetup(TIFF *, void *, tmsize_t)");
  }
  tif->tif_flags = uVar1 & 0xff7dffff;
  if (tif->tif_rawdata != (uint8_t *)0x0) {
    if ((uVar1 >> 9 & 1) != 0) {
      _TIFFfreeExt(tif,tif->tif_rawdata);
    }
    tif->tif_rawdata = (uint8_t *)0x0;
    tif->tif_rawdatasize = 0;
  }
  if (bp == (void *)0x0) {
    siz = size + 0x3ffU & 0xfffffffffffffc00;
    tif->tif_rawdatasize = siz;
    if (siz == 0) {
      TIFFErrorExtR(tif,"TIFFReadBufferSetup","Invalid buffer size");
      return 0;
    }
    puVar2 = (uint8_t *)_TIFFcallocExt(tif,1,siz);
    tif->tif_rawdata = puVar2;
    uVar1 = tif->tif_flags | 0x200;
  }
  else {
    tif->tif_rawdatasize = size;
    tif->tif_rawdata = (uint8_t *)bp;
    uVar1 = tif->tif_flags & 0xfffffdff;
  }
  tif->tif_flags = uVar1;
  bVar3 = tif->tif_rawdata == (uint8_t *)0x0;
  if (bVar3) {
    TIFFErrorExtR(tif,"TIFFReadBufferSetup","No space for data buffer at scanline %u",
                  (ulong)tif->tif_row);
    tif->tif_rawdatasize = 0;
  }
  return (uint)!bVar3;
}

Assistant:

int TIFFReadBufferSetup(TIFF *tif, void *bp, tmsize_t size)
{
    static const char module[] = "TIFFReadBufferSetup";

    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);
    tif->tif_flags &= ~TIFF_BUFFERMMAP;

    if (tif->tif_rawdata)
    {
        if (tif->tif_flags & TIFF_MYBUFFER)
            _TIFFfreeExt(tif, tif->tif_rawdata);
        tif->tif_rawdata = NULL;
        tif->tif_rawdatasize = 0;
    }
    if (bp)
    {
        tif->tif_rawdatasize = size;
        tif->tif_rawdata = (uint8_t *)bp;
        tif->tif_flags &= ~TIFF_MYBUFFER;
    }
    else
    {
        tif->tif_rawdatasize = (tmsize_t)TIFFroundup_64((uint64_t)size, 1024);
        if (tif->tif_rawdatasize == 0)
        {
            TIFFErrorExtR(tif, module, "Invalid buffer size");
            return (0);
        }
        /* Initialize to zero to avoid uninitialized buffers in case of */
        /* short reads (http://bugzilla.maptools.org/show_bug.cgi?id=2651) */
        tif->tif_rawdata =
            (uint8_t *)_TIFFcallocExt(tif, 1, tif->tif_rawdatasize);
        tif->tif_flags |= TIFF_MYBUFFER;
    }
    if (tif->tif_rawdata == NULL)
    {
        TIFFErrorExtR(tif, module,
                      "No space for data buffer at scanline %" PRIu32,
                      tif->tif_row);
        tif->tif_rawdatasize = 0;
        return (0);
    }
    return (1);
}